

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O0

char * Varint::Parse64Fallback(char *p,uint64 *OUTPUT)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint64 res3;
  uint64 res2;
  uint64 res1;
  uint64 byte;
  uchar *ptr;
  uint64 *OUTPUT_local;
  char *p_local;
  
  if ((byte)*p < 0x80) {
    __assert_fail("*ptr >= 128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.cc"
                  ,0x3f,"static const char *Varint::Parse64Fallback(const char *, uint64 *)");
  }
  byte = (uint64)(p + 2);
  res2 = ((ulong)(byte)p[1] - 1) * 0x80 + (ulong)(byte)*p;
  if (0x7f < (ulong)(byte)p[1]) {
    bVar2 = *(byte *)byte;
    res2 = ((ulong)bVar2 - 1) * 0x4000 + res2;
    byte = (uint64)(p + 3);
    if (0x7f < (ulong)bVar2) {
      uVar3 = (ulong)(byte)p[3];
      res2 = (uVar3 - 1) * 0x200000 + res2;
      byte = (uint64)(p + 4);
      if (0x7f < uVar3) {
        byte = (uint64)(p + 5);
        res3 = (uint64)(byte)p[4];
        if (0x7f < res3) {
          bVar2 = *(byte *)byte;
          res3 = ((ulong)bVar2 - 1) * 0x80 + res3;
          byte = (uint64)(p + 6);
          if (0x7f < (ulong)bVar2) {
            uVar3 = (ulong)(byte)p[6];
            res3 = (uVar3 - 1) * 0x4000 + res3;
            byte = (uint64)(p + 7);
            if (0x7f < uVar3) {
              uVar3 = (ulong)(byte)p[7];
              res3 = (uVar3 - 1) * 0x200000 + res3;
              byte = (uint64)(p + 8);
              if (0x7f < uVar3) {
                byte = (uint64)(p + 9);
                bVar2 = p[8];
                if (0x7f < bVar2) {
                  bVar1 = *(byte *)byte;
                  bVar2 = (bVar1 - 1) * -0x80 + bVar2;
                  byte = (uint64)(p + 10);
                  if (1 < bVar1) {
                    return (char *)0x0;
                  }
                }
                *OUTPUT = res2 + (res3 - 1) * 0x10000000 + ((ulong)(byte)(bVar2 - 1) << 0x38);
                return (char *)byte;
              }
            }
          }
        }
        *OUTPUT = res2 + (res3 - 1) * 0x10000000;
        return (char *)byte;
      }
    }
  }
  *OUTPUT = res2;
  return (char *)byte;
}

Assistant:

const char* Varint::Parse64Fallback(const char* p, uint64* OUTPUT) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  assert(*ptr >= 128);
#if defined(__x86_64__)
  // This approach saves one redundant operation on the last byte (masking a
  // byte that doesn't need it). This is conditional on x86 because:
  // - PowerPC has specialized bit instructions that make masking and
  //   shifting very efficient
  // - x86 seems to be one of the few architectures that has a single
  //   instruction to add 3 values.
  //
  // e.g.
  // Input: 0xff, 0x40
  // Mask & Or calculates: (0xff & 0x7f) | ((0x40 & 0x7f) << 7) = 0x207f
  // Sub1 & Add calculates: 0xff         + ((0x40    - 1) << 7) = 0x207f
  //
  // The subtract one removes the bit set by the previous byte used to
  // indicate that more bytes are present. It also has the potential to
  // allow instructions like LEA to combine 2 adds into one instruction.
  //
  // E.g. on an x86 architecture, %rcx = %rax + (%rbx - 1) << 7 could be
  // emitted as:
  //   shlq $7, %rbx
  //   leaq -0x80(%rax, %rbx), %rcx
  //
  // Fast path: need to accumulate data in upto three result fragments
  //    res1    bits 0..27
  //    res2    bits 28..55
  //    res3    bits 56..63

  uint64 byte, res1, res2 = 0, res3 = 0;
  byte = *(ptr++); res1 = byte;
  byte = *(ptr++); res1 += (byte - 1) <<  7; if (byte < 128) goto done1;
  byte = *(ptr++); res1 += (byte - 1) << 14; if (byte < 128) goto done1;
  byte = *(ptr++); res1 += (byte - 1) << 21; if (byte < 128) goto done1;

  byte = *(ptr++); res2 = byte;              if (byte < 128) goto done2;
  byte = *(ptr++); res2 += (byte - 1) <<  7; if (byte < 128) goto done2;
  byte = *(ptr++); res2 += (byte - 1) << 14; if (byte < 128) goto done2;
  byte = *(ptr++); res2 += (byte - 1) << 21; if (byte < 128) goto done2;

  byte = *(ptr++); res3 = byte;              if (byte < 128) goto done3;
  byte = *(ptr++); res3 += (byte - 1) <<  7; if (byte < 2) goto done3;

  return nullptr;       // Value is too long to be a varint64

 done1:
  assert(res2 == 0);
  assert(res3 == 0);
  *OUTPUT = res1;
  return reinterpret_cast<const char*>(ptr);

 done2:
  assert(res3 == 0);
  *OUTPUT = res1 + ((res2 - 1) << 28);
  return reinterpret_cast<const char*>(ptr);

 done3:
  *OUTPUT = res1 + ((res2 - 1) << 28) + ((res3 - 1) << 56);
  return reinterpret_cast<const char*>(ptr);
#else
  uint32 byte, res1, res2=0, res3=0;
  byte = *(ptr++); res1 = byte & 127;
  byte = *(ptr++); res1 |= (byte & 127) <<  7; if (byte < 128) goto done1;
  byte = *(ptr++); res1 |= (byte & 127) << 14; if (byte < 128) goto done1;
  byte = *(ptr++); res1 |= (byte & 127) << 21; if (byte < 128) goto done1;

  byte = *(ptr++); res2 = byte & 127;          if (byte < 128) goto done2;
  byte = *(ptr++); res2 |= (byte & 127) <<  7; if (byte < 128) goto done2;
  byte = *(ptr++); res2 |= (byte & 127) << 14; if (byte < 128) goto done2;
  byte = *(ptr++); res2 |= (byte & 127) << 21; if (byte < 128) goto done2;

  byte = *(ptr++); res3 = byte & 127;          if (byte < 128) goto done3;
  byte = *(ptr++); res3 |= (byte & 127) <<  7; if (byte < 2) goto done3;

  return nullptr;       // Value is too long to be a varint64

 done1:
  assert(res2 == 0);
  assert(res3 == 0);
  *OUTPUT = res1;
  return reinterpret_cast<const char*>(ptr);

 done2:
  assert(res3 == 0);
  *OUTPUT = res1 | (uint64(res2) << 28);
  return reinterpret_cast<const char*>(ptr);

 done3:
  *OUTPUT = res1 | (uint64(res2) << 28) | (uint64(res3) << 56);
  return reinterpret_cast<const char*>(ptr);
#endif
}